

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

bool tinyusdz::tydra::(anonymous_namespace)::ToProperty<std::__cxx11::string>
               (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *input,Property *output,string *err)

{
  bool bVar1;
  Variability *pVVar2;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *paths;
  value_type *pvVar3;
  TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  AttrMeta *pAVar4;
  AttrMeta *this_00;
  TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ts_00;
  Property local_9b0;
  undefined1 local_3d0 [8];
  TimeSamples ts;
  Value val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> a;
  optional<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  aval;
  PrimVar pvar;
  undefined1 local_2c8 [8];
  Attribute attr;
  string *err_local;
  Property *output_local;
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *input_local;
  
  attr._metas.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)err;
  Attribute::Attribute((Attribute *)local_2c8);
  pVVar2 = Attribute::variability((Attribute *)local_2c8);
  *pVVar2 = Varying;
  tinyusdz::value::
  TypeTraits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  type_name();
  Attribute::set_type_name((Attribute *)local_2c8,(string *)&pvar._ts._dirty);
  ::std::__cxx11::string::~string((string *)&pvar._ts._dirty);
  bVar1 = TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::is_blocked(input);
  if (bVar1) {
    bVar1 = TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::is_blocked(input);
    Attribute::set_blocked((Attribute *)local_2c8,bVar1);
  }
  bVar1 = TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::has_connections(input);
  if (bVar1) {
    paths = TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::get_connections(input);
    Attribute::set_connections((Attribute *)local_2c8,paths);
  }
  primvar::PrimVar::PrimVar((PrimVar *)((long)&aval.contained + 0x40));
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get_value((optional<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&a.field_2 + 8),input);
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                    ((optional *)(a.field_2._M_local_buf + 8));
  if (bVar1) {
    pvVar3 = nonstd::optional_lite::
             optional<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::value((optional<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&a.field_2 + 8));
    bVar1 = Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::is_blocked(pvVar3);
    if (bVar1) {
      Attribute::set_blocked((Attribute *)local_2c8,true);
    }
    pvVar3 = nonstd::optional_lite::
             optional<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::value((optional<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&a.field_2 + 8));
    bVar1 = Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::has_value(pvVar3);
    if (bVar1) {
      ::std::__cxx11::string::string((string *)&val.v_.vtable);
      pvVar3 = nonstd::optional_lite::
               optional<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::value((optional<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)&a.field_2 + 8));
      bVar1 = Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::get_default(pvVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&val.v_.vtable);
      if (bVar1) {
        tinyusdz::value::Value::Value<std::__cxx11::string>
                  ((Value *)&ts._dirty,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &val.v_.vtable);
        primvar::PrimVar::set_value<tinyusdz::value::Value>
                  ((PrimVar *)((long)&aval.contained + 0x40),(Value *)&ts._dirty);
        tinyusdz::value::Value::~Value((Value *)&ts._dirty);
      }
      ::std::__cxx11::string::~string((string *)&val.v_.vtable);
    }
    pvVar3 = nonstd::optional_lite::
             optional<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::value((optional<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&a.field_2 + 8));
    bVar1 = Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::has_timesamples(pvVar3);
    if (bVar1) {
      pvVar3 = nonstd::optional_lite::
               optional<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::value((optional<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)&a.field_2 + 8));
      this = Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::get_timesamples(pvVar3);
      ToTypelessTimeSamples<std::__cxx11::string>
                ((TimeSamples *)local_3d0,(_anonymous_namespace_ *)this,ts_00);
      primvar::PrimVar::set_timesamples
                ((PrimVar *)((long)&aval.contained + 0x40),(TimeSamples *)local_3d0);
      tinyusdz::value::TimeSamples::~TimeSamples((TimeSamples *)local_3d0);
    }
    pvVar3 = nonstd::optional_lite::
             optional<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::value((optional<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&a.field_2 + 8));
    bVar1 = Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::has_value(pvVar3);
    if (!bVar1) {
      pvVar3 = nonstd::optional_lite::
               optional<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::value((optional<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)&a.field_2 + 8));
      bVar1 = Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::has_timesamples(pvVar3);
      if (!bVar1) goto LAB_0048fce7;
    }
    Attribute::set_var((Attribute *)local_2c8,(PrimVar *)((long)&aval.contained + 0x40));
  }
LAB_0048fce7:
  nonstd::optional_lite::
  optional<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~optional((optional<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&a.field_2 + 8));
  primvar::PrimVar::~PrimVar((PrimVar *)((long)&aval.contained + 0x40));
  pAVar4 = TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::metas(input);
  this_00 = Attribute::metas((Attribute *)local_2c8);
  AttrMetas::operator=(this_00,pAVar4);
  Property::Property(&local_9b0,(Attribute *)local_2c8,false);
  Property::operator=(output,&local_9b0);
  Property::~Property(&local_9b0);
  Attribute::~Attribute((Attribute *)local_2c8);
  return true;
}

Assistant:

bool ToProperty(const TypedAttribute<Animatable<T>> &input, Property &output, std::string *err) {

  DCOUT("ToProperty ");
  (void)err;

  Attribute attr;

  attr.variability() = Variability::Varying;
  attr.set_type_name(value::TypeTraits<T>::type_name());

  DCOUT("has_connections" << input.has_connections());
  DCOUT("has_value " << input.has_value());
  DCOUT("is_blocked " << input.is_blocked());

  if (input.is_blocked()) {
    attr.set_blocked(input.is_blocked());
  }

  if (input.has_connections()) {
    

    attr.set_connections(input.get_connections());
  }

  //DCOUT("has_default " << input.has_default());
  //DCOUT("has_timesamples " << input.has_timesamples());

  {
    primvar::PrimVar pvar;

    // Includes !authored()
    nonstd::optional<Animatable<T>> aval = input.get_value();
    if (aval) {

      if (aval.value().is_blocked()) {
        attr.set_blocked(true);
      }

      if (aval.value().has_value()) {
        T a;
        if (aval.value().get_default(&a)) {
          value::Value val(a);
          pvar.set_value(val);
        }
      }

      if (aval.value().has_timesamples()) {
        value::TimeSamples ts = ToTypelessTimeSamples(aval.value().get_timesamples());
        pvar.set_timesamples(ts);
      }

      if (aval.value().has_value() || aval.value().has_timesamples()) {
        attr.set_var(std::move(pvar));
      }

    } else {
      DCOUT("no animatable value.");
    }
  }

  attr.metas() = input.metas();

  output = Property(std::move(attr), /*custom*/ false);

  return true;
}